

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_IteratorInitializationTooFewValues_Test<unsigned_int>::
SparseArray_IteratorInitializationTooFewValues_Test
          (SparseArray_IteratorInitializationTooFewValues_Test<unsigned_int> *this)

{
  SparseArray_IteratorInitializationTooFewValues_Test<unsigned_int> *this_local;
  
  anon_unknown.dwarf_92f3e::SparseArray<unsigned_int>::SparseArray
            (&this->super_SparseArray<unsigned_int>);
  (this->super_SparseArray<unsigned_int>).super_Test._vptr_Test =
       (_func_int **)&PTR__SparseArray_IteratorInitializationTooFewValues_Test_00352620;
  return;
}

Assistant:

TYPED_TEST (SparseArray, IteratorInitializationTooFewValues) {
    std::vector<std::size_t> i1{0, 2, 4};
    std::vector<int> v1{1};

    auto arrp = sparse_array<int, TypeParam>::make_unique (std::begin (i1), std::end (i1),
                                                           std::begin (v1), std::end (v1));
    auto & arr = *arrp;

    EXPECT_EQ (arr[0], 1);
    EXPECT_FALSE (arr.has_index (1));
    EXPECT_EQ (arr[2], 0);
    EXPECT_FALSE (arr.has_index (3));
    EXPECT_EQ (arr[4], 0);
}